

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

void idx2::Init<char_const*,void(*)()>
               (hash_table<const_char_*,_void_(*)()> *Ht,i64 LogCapacityIn,allocator *AllocIn)

{
  bucket_status *pbVar1;
  long lVar2;
  long lVar3;
  
  Ht->Alloc = AllocIn;
  Ht->LogCapacity = LogCapacityIn;
  lVar3 = 1L << ((byte)LogCapacityIn & 0x3f);
  lVar2 = lVar3 + 1;
  AllocPtr<char_const*>(&Ht->Keys,lVar2,AllocIn);
  AllocPtr<void(*)()>(&Ht->Vals,lVar2,AllocIn);
  AllocPtr<idx2::hash_table<char_const*,void(*)()>::bucket_status>(&Ht->Stats,lVar2,AllocIn);
  pbVar1 = Ht->Stats;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 1) {
    pbVar1[lVar2] = Empty;
  }
  pbVar1[lVar3] = Occupied;
  return;
}

Assistant:

void
Init(hash_table<k, v>* Ht, i64 LogCapacityIn, allocator* AllocIn = &Mallocator())
{
  Ht->Alloc = AllocIn;
  Ht->LogCapacity = LogCapacityIn;
  i64 Capacity = 1ll << LogCapacityIn;
  AllocPtr(&Ht->Keys, Capacity + 1, AllocIn);
  AllocPtr(&Ht->Vals, Capacity + 1, AllocIn);
  AllocPtr(&Ht->Stats, Capacity + 1, AllocIn);
  Fill(Ht->Stats, Ht->Stats + Capacity, hash_table<k, v>::Empty);
  Ht->Stats[Capacity] = hash_table<k, v>::Occupied; // sentinel
}